

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O1

void __thiscall
OpenMD::Integrator::setRNEMD
          (Integrator *this,
          unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *rnemd)

{
  RNEMD *pRVar1;
  RNEMD *pRVar2;
  
  pRVar1 = (rnemd->_M_t).
           super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
           .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl;
  (rnemd->_M_t).
  super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
  super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl = (RNEMD *)0x0;
  pRVar2 = (this->rnemd_)._M_t.
           super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>
           .super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl;
  (this->rnemd_)._M_t.
  super___uniq_ptr_impl<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::RNEMD::RNEMD_*,_std::default_delete<OpenMD::RNEMD::RNEMD>_>.
  super__Head_base<0UL,_OpenMD::RNEMD::RNEMD_*,_false>._M_head_impl = pRVar1;
  if (pRVar2 != (RNEMD *)0x0) {
    (*pRVar2->_vptr_RNEMD[1])();
    return;
  }
  return;
}

Assistant:

void Integrator::setRNEMD(std::unique_ptr<RNEMD::RNEMD> rnemd) {
    rnemd_ = std::move(rnemd);
  }